

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O3

char * basic_get(amqp_connection_state_t connection_state_,char *queue_name_,
                uint64_t *out_body_size_)

{
  int iVar1;
  char *__dest;
  amqp_bytes_t queue;
  amqp_time_t deadline;
  timeval timeout;
  amqp_message_t message;
  amqp_time_t local_170;
  timeval local_168;
  amqp_rpc_reply_t local_158;
  amqp_message_t local_138;
  
  local_168.tv_sec = 5;
  local_168.tv_usec = 0;
  iVar1 = amqp_time_from_now(&local_170,&local_168);
  if (iVar1 != 0) {
    __assert_fail("time_rc == AMQP_STATUS_OK",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x5f,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
  }
  while( true ) {
    queue = amqp_cstring_bytes(queue_name_);
    amqp_basic_get((amqp_rpc_reply_t *)&local_138,connection_state_,1,queue,1);
    if ((local_138.properties._flags != 1) ||
       ((int)local_138.properties.content_type.len != 0x3c0048)) break;
    iVar1 = amqp_time_has_past(local_170);
    if (iVar1 != 0) {
LAB_00102653:
      __assert_fail("rpc_reply.reply.id == AMQP_BASIC_GET_OK_METHOD",
                    "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                    ,0x69,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
    }
  }
  if (local_138.properties._flags != 1) {
    __assert_fail("rpc_reply.reply_type == AMQP_RESPONSE_NORMAL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x68,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
  }
  if ((int)local_138.properties.content_type.len == 0x3c0047) {
    amqp_read_message(&local_158,connection_state_,1,&local_138,0);
    if (local_158.reply_type == AMQP_RESPONSE_NORMAL) {
      __dest = (char *)malloc(local_138.body.len);
      memcpy(__dest,local_138.body.bytes,local_138.body.len);
      *out_body_size_ = local_138.body.len;
      amqp_destroy_message(&local_138);
      return __dest;
    }
    __assert_fail("rpc_reply.reply_type == AMQP_RESPONSE_NORMAL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x6e,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
  }
  goto LAB_00102653;
}

Assistant:

char *basic_get(amqp_connection_state_t connection_state_,
                const char *queue_name_, uint64_t *out_body_size_) {
  amqp_rpc_reply_t rpc_reply;
  amqp_time_t deadline;
  struct timeval timeout = {5, 0};
  int time_rc = amqp_time_from_now(&deadline, &timeout);
  assert(time_rc == AMQP_STATUS_OK);

  do {
    rpc_reply = amqp_basic_get(connection_state_, fixed_channel_id,
                               amqp_cstring_bytes(queue_name_), /*no_ack*/ 1);
  } while (rpc_reply.reply_type == AMQP_RESPONSE_NORMAL &&
           rpc_reply.reply.id == AMQP_BASIC_GET_EMPTY_METHOD &&
           amqp_time_has_past(deadline) == AMQP_STATUS_OK);

  assert(rpc_reply.reply_type == AMQP_RESPONSE_NORMAL);
  assert(rpc_reply.reply.id == AMQP_BASIC_GET_OK_METHOD);

  amqp_message_t message;
  rpc_reply =
      amqp_read_message(connection_state_, fixed_channel_id, &message, 0);
  assert(rpc_reply.reply_type == AMQP_RESPONSE_NORMAL);

  char *body = malloc(message.body.len);
  memcpy(body, message.body.bytes, message.body.len);
  *out_body_size_ = message.body.len;
  amqp_destroy_message(&message);

  return body;
}